

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

void __thiscall
Minisat::DoubleOption::printOptions(DoubleOption *this,FILE *pcsFile,int granularity)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_50;
  
  pcVar3 = strstr((this->super_Option).name,"debug");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strstr((this->super_Option).description,"debug");
    if (pcVar3 == (char *)0x0) {
      iVar2 = (*(this->super_Option)._vptr_Option[10])(this);
      if ((char)iVar2 != '\0') {
        dVar10 = 0.0;
        local_50 = 0.0;
        if ((this->range).begin_inclusive == false) {
          local_50 = 0.0001;
        }
        if ((this->range).end_inclusive == false) {
          dVar10 = 0.0001;
        }
        dVar8 = (this->range).end;
        if (dVar8 < INFINITY) {
          dVar9 = dVar8 - dVar10;
        }
        else {
          dVar9 = 1000000.0;
          if (1000000.0 < this->defaultValue) {
            dVar9 = this->defaultValue;
          }
        }
        if (granularity != 0) {
          bVar5 = false;
          fprintf((FILE *)pcsFile,"%s  {",(this->super_Option).name);
          bVar4 = false;
          if (1 < granularity) {
            dVar10 = (this->range).begin + local_50;
            if (dVar10 <= dVar9) {
              dVar8 = dVar9 - dVar10;
              bVar5 = false;
              bVar1 = false;
              do {
                dVar6 = (this->range).begin + local_50;
                if ((dVar10 != dVar6) || (NAN(dVar10) || NAN(dVar6))) {
                  fputc(0x2c,(FILE *)pcsFile);
                }
                fprintf((FILE *)pcsFile,"%.4lf",dVar10);
                dVar6 = round(dVar10 * 10000.0);
                dVar7 = round(this->defaultValue * 10000.0);
                bVar4 = true;
                if (dVar6 != dVar7) {
                  bVar4 = bVar5;
                }
                if (NAN(dVar6) || NAN(dVar7)) {
                  bVar4 = bVar5;
                }
                bVar5 = bVar4;
                dVar7 = round(this->value * 10000.0);
                bVar4 = true;
                if (dVar6 != dVar7) {
                  bVar4 = bVar1;
                }
                if (NAN(dVar6) || NAN(dVar7)) {
                  bVar4 = bVar1;
                }
                dVar10 = dVar10 + dVar8 / (double)(granularity + -1);
                bVar1 = bVar4;
              } while (dVar10 <= dVar9);
            }
            else {
              bVar5 = false;
              bVar4 = false;
            }
          }
          if (!bVar4) {
            fprintf((FILE *)pcsFile,",%.4lf",this->value);
          }
          if (!bVar5) {
            dVar10 = this->defaultValue;
            dVar8 = round(dVar10 * 10000.0);
            dVar9 = round(this->value * 10000.0);
            if ((dVar8 != dVar9) || (NAN(dVar8) || NAN(dVar9))) {
              fprintf((FILE *)pcsFile,",%.4lf",dVar10);
            }
          }
          fprintf((FILE *)pcsFile,"} [%.4lf]    # %s\n",this->value,(this->super_Option).description
                 );
          return;
        }
        local_50 = local_50 + (this->range).begin;
        if ((0.0 < local_50) || (dVar8 < dVar10)) {
          pcVar3 = "%s  [%lf,%lf] [%lf]l   # %s\n";
        }
        else {
          pcVar3 = "%s  [%lf,%lf] [%lf]    # %s\n";
        }
        fprintf((FILE *)pcsFile,pcVar3,local_50,dVar9,this->value,(this->super_Option).name,
                (this->super_Option).description);
        return;
      }
    }
  }
  return;
}

Assistant:

void printOptions(FILE *pcsFile, int granularity)
    {
        if (strstr(name, "debug") != 0 || strstr(description, "debug") != 0) {
            return;
        } // do not print the parameter, if its related to debug output
        if (!wouldPrintOption()) {
            return;
        } // do not print option?

        // print only, if there is a default
        // choose between logarithmic scale and linear scale based on the number of elements in the list - more than 16 elements means it should be log (simple heuristic)
        double badd = 0, esub = 0;
        if (!range.begin_inclusive) {
            badd = 0.0001;
        }
        if (!range.end_inclusive) {
            esub = 0.0001;
        }
        // always logarithmic
        double endValue = range.end == HUGE_VAL ? (defaultValue > 1000000.0 ? defaultValue : 1000000.0) : range.end - esub;
        if (granularity == 0) { // use interval
            if (range.begin + badd > 0 || range.end - esub < 0) {
                fprintf(pcsFile, "%s  [%lf,%lf] [%lf]l   # %s\n", name, range.begin + badd, endValue, value, description);
            } else {
                fprintf(pcsFile, "%s  [%lf,%lf] [%lf]    # %s\n", name, range.begin + badd, endValue, value, description);
            }
        } else {                             // print linear distributed sampling for double option
            fprintf(pcsFile, "%s  {", name); // print name
            bool hitDefault = false;
            bool hitValue = false;
            if (granularity > 1) {
                double diff = (endValue - (range.begin + badd)) / (double)(granularity - 1);
                for (double v = range.begin + badd; v <= endValue; v += diff) {
                    if (v != range.begin + badd) {
                        fprintf(pcsFile, ",");
                    }                             // print comma, if there will be more and we printed one item already
                    fprintf(pcsFile, "%.4lf", v); // print current value
                    if (round(v * 10000) == round(defaultValue * 10000)) {
                        hitDefault = true;
                    } // otherwise we run into precision problems
                    if (round(v * 10000) == round(value * 10000)) {
                        hitValue = true;
                    } // otherwise we run into precision problems
                }
            }
            if (!hitValue) {
                fprintf(pcsFile, ",%.4lf", value);
            } // print current value of option as well!
            if (!hitDefault && round(defaultValue * 10000) != round(value * 10000)) {
                fprintf(pcsFile, ",%.4lf", defaultValue);
            } // print default value of option as well!
            fprintf(pcsFile, "} [%.4lf]    # %s\n", value, description);
        }
    }